

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::swap
          (WorkData *this,uint32_t aVarId,uint32_t aRegId,uint32_t bVarId,uint32_t bRegId)

{
  bool bVar1;
  
  bVar1 = isAssigned(this,aRegId);
  if (!bVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x87,"isAssigned(aRegId)");
  }
  bVar1 = isAssigned(this,bRegId);
  if (!bVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x88,"isAssigned(bRegId)");
  }
  if (this->_physToVarId[aRegId] != aVarId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x89,"_physToVarId[aRegId] == aVarId");
  }
  if (this->_physToVarId[bRegId] == bVarId) {
    this->_physToVarId[aRegId] = (uint8_t)bVarId;
    this->_physToVarId[bRegId] = (uint8_t)aVarId;
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
             ,0x8a,"_physToVarId[bRegId] == bVarId");
}

Assistant:

inline void swap(uint32_t aVarId, uint32_t aRegId, uint32_t bVarId, uint32_t bRegId) noexcept {
      ASMJIT_ASSERT(isAssigned(aRegId));
      ASMJIT_ASSERT(isAssigned(bRegId));
      ASMJIT_ASSERT(_physToVarId[aRegId] == aVarId);
      ASMJIT_ASSERT(_physToVarId[bRegId] == bVarId);

      _physToVarId[aRegId] = uint8_t(bVarId);
      _physToVarId[bRegId] = uint8_t(aVarId);
    }